

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-bi.c
# Opt level: O3

void eventfd_wait(int descriptor,uint64_t wanted)

{
  ssize_t sVar1;
  uint64_t stored;
  uint64_t local_20;
  
  while( true ) {
    sVar1 = read(descriptor,&local_20,8);
    if (sVar1 == -1) {
      throw("Error reading from eventfd");
    }
    if (local_20 == wanted) break;
    sVar1 = write(descriptor,&local_20,8);
    if (sVar1 == -1) {
      throw("Error writing back to eventfd");
    }
  }
  return;
}

Assistant:

void eventfd_wait(int descriptor, uint64_t wanted) {
	uint64_t stored;

	while (true) {
		// A read from an eventfd returns the 8-byte integer
		// stored in the eventfd object *and* resets the value
		// to zero. That is, unless the EFD_SEMAPHORE flag was
		// passed at the start. In that case, the returned value
		// is *always* 1 and the stored value is decremented by
		// 1 (not reset to zero).
		if (read(descriptor, &stored, 8) == -1) {
			throw("Error reading from eventfd");
		}

		if (stored == wanted) {
			return;
		}

		// If this was not the value we were looking for
		// (e.g. if the server read the signal it set)
		// then write it back.
		if (write(descriptor, &stored, 8) == -1) {
			throw("Error writing back to eventfd");
		}
	}
}